

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward.c
# Opt level: O1

void partial_op(float64 *p_op,float64 op,float64 **den,uint32 **den_idx,float32 **mixw,uint32 n_feat
               ,uint32 n_top)

{
  ulong uVar1;
  ulong uVar2;
  double dVar3;
  
  if (n_feat != 0) {
    uVar1 = 0;
    do {
      dVar3 = (double)(float)mixw[uVar1][*den_idx[uVar1]] * (double)*den[uVar1];
      if (1 < n_top) {
        uVar2 = 1;
        do {
          dVar3 = dVar3 + (double)(float)mixw[uVar1][den_idx[uVar1][uVar2]] *
                          (double)den[uVar1][uVar2];
          uVar2 = uVar2 + 1;
        } while (n_top != uVar2);
      }
      p_op[uVar1] = (float64)((double)op / dVar3);
      uVar1 = uVar1 + 1;
    } while (uVar1 != n_feat);
  }
  return;
}

Assistant:

void
partial_op(float64 *p_op,
	   float64 op,

	   float64 **den,
	   uint32  **den_idx,
	   float32 **mixw,

	   uint32 n_feat,
	   uint32 n_top)
{
    uint32 j, k, kk;
    float64 f_op;

    for (j = 0; j < n_feat; j++) {	/* over all feature streams */

	/* Evaluate the mixture density for feature stream j
	 * gvn. component density values */
	k = den_idx[j][0];
	f_op = mixw[j][k] * den[j][0];
	for (kk = 1; kk < n_top; kk++) {
	    k = den_idx[j][kk];
	    f_op += mixw[j][k] * den[j][kk];
	}
	
	/* Figure out partial output probability excluding
	 * the given feature stream j. */
        /* That is technically correct but quite confusing, because
         * actually what we are trying to achieve here is a
         * normalization by f_op when we go to compute the mixture
         * posteriors.  See below. */
	p_op[j] = op / f_op;
    }
}